

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFolder.cpp
# Opt level: O0

void __thiscall license::locate::ApplicationFolder::ApplicationFolder(ApplicationFolder *this)

{
  allocator local_31;
  string local_30;
  ApplicationFolder *local_10;
  ApplicationFolder *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"ApplicationFolder",&local_31);
  LocatorStrategy::LocatorStrategy(&this->super_LocatorStrategy,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_LocatorStrategy)._vptr_LocatorStrategy =
       (_func_int **)&PTR_get_strategy_name_abi_cxx11__005c7e48;
  return;
}

Assistant:

ApplicationFolder::ApplicationFolder() : LocatorStrategy("ApplicationFolder") {}